

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

void __thiscall pbrt::RGBSpectrum::RGBSpectrum(RGBSpectrum *this,RGBColorSpace *cs,RGB *rgb)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  Float FVar5;
  float *__result;
  RGB *pRVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  RGBSigmoidPolynomial RVar12;
  RGB local_18;
  undefined1 auVar10 [56];
  
  pRVar6 = &local_18;
  (this->rgb).b = rgb->b;
  FVar5 = rgb->g;
  (this->rgb).r = rgb->r;
  (this->rgb).g = FVar5;
  this->illuminant = &cs->illuminant;
  local_18.r = rgb->r;
  local_18.g = rgb->g;
  local_18.b = rgb->b;
  lVar7 = 4;
  do {
    if (pRVar6->r < *(float *)((long)&local_18.r + lVar7)) {
      pRVar6 = (RGB *)((long)&local_18.r + lVar7);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  fVar4 = pRVar6->r + pRVar6->r;
  this->scale = fVar4;
  auVar8 = ZEXT816(0);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    uVar1 = rgb->r;
    uVar3 = rgb->g;
    auVar8._4_4_ = uVar3;
    auVar8._0_4_ = uVar1;
    auVar8._8_8_ = 0;
    auVar11._4_4_ = fVar4;
    auVar11._0_4_ = fVar4;
    auVar11._8_4_ = fVar4;
    auVar11._12_4_ = fVar4;
    auVar11 = vdivps_avx(auVar8,auVar11);
    auVar8 = ZEXT416((uint)(rgb->b / fVar4));
  }
  else {
    auVar11 = ZEXT816(0) << 0x40;
  }
  auVar10 = ZEXT856(auVar8._8_8_);
  local_18._0_8_ = vmovlps_avx(auVar11);
  local_18.b = auVar8._0_4_;
  RVar12 = RGBColorSpace::ToRGBCoeffs(cs,&local_18);
  auVar9._0_8_ = RVar12._0_8_;
  auVar9._8_56_ = auVar10;
  uVar2 = vmovlps_avx(auVar9._0_16_);
  (this->rsp).c0 = (Float)(int)uVar2;
  (this->rsp).c1 = (Float)(int)((ulong)uVar2 >> 0x20);
  (this->rsp).c2 = RVar12.c2;
  return;
}

Assistant:

RGBSpectrum::RGBSpectrum(const RGBColorSpace &cs, const RGB &rgb)
    : rgb(rgb), illuminant(&cs.illuminant) {
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    scale = 2 * m;
    rsp = cs.ToRGBCoeffs(scale ? rgb / scale : RGB(0, 0, 0));
}